

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

const_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::find<int>(const_iterator *__return_storage_ptr__,
           sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,int *key)

{
  pointer psVar1;
  pointer psVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  const_nonempty_iterator local_40;
  
  if ((this->table).settings.num_buckets != this->num_deleted) {
    pVar3 = find_position<int>(this,key);
    if (pVar3.first != 0xffffffffffffffff) {
      sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
      ::get_iter(&local_40,&this->table,pVar3.first);
      psVar1 = (this->table).groups.
               super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (this->table).groups.
               super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->pos).row_current._M_current = local_40.row_current._M_current;
      (__return_storage_ptr__->pos).col_current = local_40.col_current;
      (__return_storage_ptr__->pos).row_begin._M_current = local_40.row_begin._M_current;
      (__return_storage_ptr__->pos).row_end._M_current = local_40.row_end._M_current;
      __return_storage_ptr__->ht = this;
      goto LAB_006e5f01;
    }
  }
  psVar1 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __return_storage_ptr__->ht = this;
  (__return_storage_ptr__->pos).row_begin._M_current = psVar1;
  (__return_storage_ptr__->pos).row_end._M_current = psVar2;
  (__return_storage_ptr__->pos).row_current._M_current = psVar2;
  (__return_storage_ptr__->pos).col_current = (const_nonempty_iterator)0x0;
LAB_006e5f01:
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  (__return_storage_ptr__->end).row_current._M_current = psVar2;
  (__return_storage_ptr__->end).col_current = (const_nonempty_iterator)0x0;
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const_iterator find(const K& key) const {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return const_iterator(this, table.get_iter(pos.first),
                            table.nonempty_end());
  }